

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

void __thiscall
cfd::core::TaprootScriptTree::AddBranch(TaprootScriptTree *this,TaprootScriptTree *tree)

{
  ByteData256 local_30;
  TaprootScriptTree *local_18;
  TaprootScriptTree *tree_local;
  TaprootScriptTree *this_local;
  
  local_18 = tree;
  tree_local = this;
  TapBranch::AddBranch(&this->super_TapBranch,&tree->super_TapBranch);
  TapBranch::GetCurrentBranchHash(&local_30,&local_18->super_TapBranch);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
  emplace_back<cfd::core::ByteData256>(&this->nodes_,&local_30);
  ByteData256::~ByteData256((ByteData256 *)0x494526);
  return;
}

Assistant:

void TaprootScriptTree::AddBranch(const TaprootScriptTree& tree) {
  TapBranch::AddBranch(tree);
  nodes_.emplace_back(tree.GetCurrentBranchHash());
}